

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O1

int MRIStepReset(void *arkode_mem,realtype tR,N_Vector yR)

{
  int error_code;
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  ARKodeMem local_28;
  ARKodeMRIStepMem local_20;
  
  error_code = mriStep_AccessStepMem(arkode_mem,"MRIStepReset",&local_28,&local_20);
  if (error_code == 0) {
    error_code = arkInit(local_28,tR,yR,1);
    if (error_code == 0) {
      error_code = 0;
    }
    else {
      arkProcessError(local_28,error_code,"ARKode::MRIStep","MRIStepReset",
                      "Unable to initialize main ARKode infrastructure");
    }
  }
  return error_code;
}

Assistant:

int MRIStepReset(void* arkode_mem, realtype tR, N_Vector yR)
{
  ARKodeMem ark_mem;
  ARKodeMRIStepMem step_mem;
  int retval;

  /* access ARKodeMRIStepMem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "MRIStepReset",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

  /* Initialize main ARKode infrastructure */
  retval = arkInit(ark_mem, tR, yR, RESET_INIT);

  if (retval != ARK_SUCCESS) {
    arkProcessError(ark_mem, retval, "ARKode::MRIStep", "MRIStepReset",
                    "Unable to initialize main ARKode infrastructure");
    return(retval);
  }

  return(ARK_SUCCESS);
}